

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_arena.h
# Opt level: O3

void __thiscall
ArenaVectorBase<ArenaVector<wasm::Type>,wasm::Type>::
set<std::vector<wasm::Type,std::allocator<wasm::Type>>>
          (ArenaVectorBase<ArenaVector<wasm::Type>,wasm::Type> *this,
          vector<wasm::Type,_std::allocator<wasm::Type>_> *list)

{
  void *pvVar1;
  pointer pTVar2;
  pointer pTVar3;
  uintptr_t *puVar4;
  ulong uVar5;
  
  pTVar2 = (list->super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pTVar3 = (list->super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  uVar5 = (long)pTVar3 - (long)pTVar2 >> 3;
  if (*(ulong *)(this + 0x10) < uVar5) {
    *(ulong *)(this + 0x10) = uVar5;
    pvVar1 = MixedArena::allocSpace(*(MixedArena **)(this + 0x18),(long)pTVar3 - (long)pTVar2,8);
    *(void **)this = pvVar1;
    pTVar2 = (list->super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pTVar3 = (list->super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>)._M_impl.
             super__Vector_impl_data._M_finish;
  }
  if (pTVar2 != pTVar3) {
    puVar4 = *(uintptr_t **)this;
    do {
      *puVar4 = pTVar2->id;
      pTVar2 = pTVar2 + 1;
      puVar4 = puVar4 + 1;
    } while (pTVar2 != pTVar3);
  }
  *(ulong *)(this + 8) = uVar5;
  return;
}

Assistant:

void set(const ListType& list) {
    size_t size = list.size();
    if (allocatedElements < size) {
      static_cast<SubType*>(this)->allocate(size);
    }
    size_t i = 0;
    for (auto elem : list) {
      data[i++] = elem;
    }
    usedElements = size;
  }